

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

void av1_rd_pick_palette_intra_sby
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int dc_mode_cost,
               MB_MODE_INFO *best_mbmi,uint8_t *best_palette_color_map,int64_t *best_rd,int *rate,
               int *rate_tokenonly,int64_t *distortion,uint8_t *skippable,int *beat_best_rd,
               PICK_MODE_CONTEXT *ctx,uint8_t *best_blk_skip,uint8_t *tx_type_map)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint8_t uVar4;
  aom_bit_depth_t bit_depth;
  SequenceHeader *pSVar5;
  short sVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  int iVar9;
  int iVar10;
  undefined7 in_register_00000011;
  long lVar11;
  int n;
  uint uVar12;
  int iVar13;
  int iVar14;
  int16_t *piVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ushort uVar19;
  int n_2;
  ulong uVar20;
  int n_4;
  byte *src;
  ulong uVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  long lVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  _Bool local_4521;
  int beat_best_palette_rd;
  int local_451c;
  int local_4518;
  int local_4514;
  undefined8 local_4510;
  int local_4504;
  AV1_COMP *local_4500;
  uint local_44f4;
  ulong local_44f0;
  undefined8 local_44e8;
  undefined8 local_44e0;
  int16_t *local_44d8;
  MB_MODE_INFO *local_44d0;
  MB_MODE_INFO *local_44c8;
  int colors;
  long local_44b8;
  MACROBLOCK *local_44b0;
  uint8_t *local_44a8;
  ulong local_44a0;
  size_t local_4498;
  int colors_threshold;
  uint8_t *local_4488;
  uint local_4480;
  uint local_447c;
  int16_t top_colors [8];
  uint16_t color_cache [16];
  int count_buf_8bit [256];
  int count_buf [4096];
  
  local_44d0 = *(x->e_mbd).mi;
  local_4514 = (int)CONCAT71(in_register_00000011,bsize);
  uVar18 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar1 = block_size_high[uVar18];
  iVar8 = (x->e_mbd).mb_to_bottom_edge;
  iVar10 = (x->e_mbd).mb_to_right_edge;
  bVar2 = (byte)(x->e_mbd).plane[0].subsampling_x;
  local_447c = (uint)(block_size_wide[uVar18] >> (bVar2 & 0x1f));
  bVar3 = (byte)(x->e_mbd).plane[0].subsampling_y;
  local_4518 = (int)((iVar8 >> 0x1f & iVar8 >> 3) + (uint)bVar1) >> (bVar3 & 0x1f);
  uVar7 = (int)((iVar10 >> 0x1f & iVar10 >> 3) + (uint)block_size_wide[uVar18]) >> (bVar2 & 0x1f);
  iVar8 = x->plane[0].src.stride;
  pSVar5 = (cpi->common).seq_params;
  uVar4 = pSVar5->use_highbitdepth;
  bit_depth = pSVar5->bit_depth;
  src = x->plane[0].src.buf;
  local_44a0 = (ulong)(uint)(cpi->sf).rt_sf.use_nonrd_pick_mode;
  colors_threshold = 0;
  local_44e0 = CONCAT71(local_44e0._1_7_,uVar4);
  local_4510 = CONCAT44(local_4510._4_4_,bit_depth);
  local_4504 = dc_mode_cost;
  local_44c8 = best_mbmi;
  local_44a8 = best_palette_color_map;
  if (uVar4 == '\0') {
    av1_count_colors(src,iVar8,local_4518,uVar7,count_buf,&colors);
    colors_threshold = colors;
  }
  else {
    av1_count_colors_highbd
              (src,iVar8,local_4518,uVar7,bit_depth,count_buf,count_buf_8bit,&colors_threshold,
               &colors);
  }
  iVar10 = x->color_palette_thresh;
  iVar9 = iVar10;
  if (((((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) &&
       ((cpi->sf).rt_sf.increase_color_thresh_palette == true)) && ((cpi->rc).high_source_sad != 0))
     && (0x32 < x->source_variance)) {
    if ((x->color_sensitivity[0] == '\0') && (x->color_sensitivity[1] == '\0')) {
      lVar11 = 0;
    }
    else {
      lVar11 = x->min_dist_inter_uv >> (""[uVar18] + ""[uVar18] & 0x3f);
      if (x->color_sensitivity[0] != '\0') {
        lVar11 = lVar11 >> (x->color_sensitivity[1] != '\0');
      }
    }
    iVar9 = iVar10 + 0x14;
    if (7999 < lVar11) {
      iVar9 = iVar10;
    }
  }
  local_4488 = (x->e_mbd).plane[0].color_index_map;
  if ((1 < colors_threshold) && (colors_threshold <= iVar9)) {
    local_44d8 = x->palette_buffer->kmeans_data_buf;
    if ((char)local_44e0 == '\0') {
      uVar16 = (uint)*src;
      uVar12 = uVar16;
      if (0 < local_4518) {
        iVar10 = 0;
        piVar15 = local_44d8;
        do {
          if (0 < (int)uVar7) {
            uVar18 = 0;
            uVar17 = uVar16;
            do {
              uVar19 = (ushort)src[uVar18];
              if (uVar19 <= uVar12) {
                uVar12 = (uint)uVar19;
              }
              piVar15[uVar18] = uVar19;
              uVar16 = (uint)uVar19;
              if (uVar19 < uVar17) {
                uVar16 = uVar17;
              }
              uVar18 = uVar18 + 1;
              uVar17 = uVar16;
            } while (uVar7 != uVar18);
          }
          src = src + iVar8;
          iVar10 = iVar10 + 1;
          piVar15 = piVar15 + (int)uVar7;
        } while (iVar10 != local_4518);
      }
    }
    else {
      uVar16 = (uint)*(ushort *)((long)src * 2);
      uVar12 = uVar16;
      if (0 < local_4518) {
        lVar11 = (long)src * 2;
        iVar10 = 0;
        piVar15 = local_44d8;
        do {
          if (0 < (int)uVar7) {
            uVar18 = 0;
            uVar17 = uVar16;
            do {
              uVar19 = *(ushort *)(lVar11 + uVar18 * 2);
              if (uVar19 <= uVar12) {
                uVar12 = (uint)uVar19;
              }
              piVar15[uVar18] = uVar19;
              uVar16 = (uint)uVar19;
              if (uVar19 < uVar17) {
                uVar16 = uVar17;
              }
              uVar18 = uVar18 + 1;
              uVar17 = uVar16;
            } while (uVar7 != uVar18);
          }
          iVar10 = iVar10 + 1;
          piVar15 = piVar15 + (int)uVar7;
          lVar11 = lVar11 + (long)iVar8 * 2;
        } while (iVar10 != local_4518);
      }
    }
    iVar10 = 0;
    local_44d0->mode = '\0';
    (local_44d0->filter_intra_mode_info).use_filter_intra = '\0';
    local_4500 = cpi;
    local_44f4 = uVar7;
    local_44b0 = x;
    iVar8 = av1_get_palette_cache(&x->e_mbd,0,color_cache);
    local_44e0 = CONCAT44(extraout_var,iVar8);
    top_colors[0] = 0;
    top_colors[1] = 0;
    top_colors[2] = 0;
    top_colors[3] = 0;
    top_colors[4] = 0;
    top_colors[5] = 0;
    top_colors[6] = 0;
    top_colors[7] = 0;
    local_451c = colors;
    uVar18 = 8;
    if (colors < 8) {
      uVar18 = (ulong)(uint)colors;
    }
    count_buf_8bit[0xc] = 0;
    count_buf_8bit[0xd] = 0;
    count_buf_8bit[0xe] = 0;
    count_buf_8bit[0xf] = 0;
    count_buf_8bit[8] = 0;
    count_buf_8bit[9] = 0;
    count_buf_8bit[10] = 0;
    count_buf_8bit[0xb] = 0;
    count_buf_8bit[4] = 0;
    count_buf_8bit[5] = 0;
    count_buf_8bit[6] = 0;
    count_buf_8bit[7] = 0;
    count_buf_8bit[0] = 0;
    count_buf_8bit[1] = 0;
    count_buf_8bit[2] = 0;
    count_buf_8bit[3] = 0;
    if ((int)local_4510 != 0x1f) {
      uVar7 = 1 << ((byte)local_4510 & 0x1f);
      local_4480 = (int)uVar18 - 1;
      local_44f0 = (ulong)local_4480;
      local_44b8 = (long)(int)local_4480;
      local_4480 = (int)local_4480 >> 0x1f & local_4480;
      if ((int)uVar7 < 2) {
        uVar7 = 1;
      }
      uVar20 = (ulong)uVar7;
      local_4498 = (size_t)(int)uVar18;
      uVar21 = 0;
      local_4510 = uVar18;
      local_44e8 = uVar20;
      do {
        iVar8 = count_buf[uVar21];
        if (0 < iVar8) {
          iVar9 = (int)uVar18;
          if (iVar10 < iVar9) {
            count_buf_8bit[(long)iVar10 * 2] = (int)uVar21;
            count_buf_8bit[(long)iVar10 * 2 + 1] = iVar8;
            iVar10 = iVar10 + 1;
            if (iVar10 == iVar9) {
              qsort(count_buf_8bit,local_4498,8,color_count_comp);
              uVar18 = local_4510;
            }
          }
          else if (count_buf_8bit[local_44b8 * 2 + 1] < iVar8) {
            uVar18 = uVar18 & 0xffffffff;
            uVar20 = local_44f0;
            do {
              uVar7 = local_4480;
              if ((int)uVar20 < 1) break;
              uVar7 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar7;
              lVar11 = uVar20 * 2;
              uVar20 = uVar20 - 1;
            } while (count_buf_8bit[lVar11 + -1] < iVar8);
            lVar11 = (long)(int)uVar7;
            memmove(count_buf_8bit + lVar11 * 2 + 2,count_buf_8bit + lVar11 * 2,
                    (long)(int)(~uVar7 + iVar9) << 3);
            count_buf_8bit[lVar11 * 2] = (int)uVar21;
            count_buf_8bit[lVar11 * 2 + 1] = iVar8;
            uVar18 = local_4510;
            uVar20 = local_44e8;
          }
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != uVar20);
    }
    if (0 < local_451c) {
      uVar20 = 0;
      do {
        top_colors[uVar20] = (int16_t)count_buf_8bit[uVar20 * 2];
        uVar20 = uVar20 + 1;
      } while ((uVar18 & 0xffffffff) != uVar20);
    }
    local_44b8 = CONCAT44(local_44b8._4_4_,
                          (local_4500->sf).intra_sf.prune_luma_palette_size_search_level);
    local_4510 = 8;
    if (colors < 8) {
      local_4510 = (ulong)(uint)colors;
    }
    sVar6 = (short)uVar12;
    if (colors < 3 || (local_4500->sf).intra_sf.prune_palette_search_level != 1) {
      local_44f0 = CONCAT44(local_44f0._4_4_,(int)local_4510 + 1);
      iVar8 = 2;
      local_451c = colors;
      if (1 < colors) {
        iVar10 = 2;
        local_44e8 = CONCAT44(local_44e8._4_4_,local_4514) & 0xffffffff000000ff;
        do {
          bVar22 = (int)local_44b8 != 0;
          beat_best_palette_rd = 0;
          local_4521 = false;
          memcpy(count_buf_8bit,top_colors,(long)iVar10 * 2);
          palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,local_44d8
                       ,(int16_t *)count_buf_8bit,iVar10,color_cache,(int)local_44e0,bVar22,
                       local_44c8,local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,
                       beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4521,
                       (int)local_44a0);
          bVar22 = true;
          if (local_4521 == false) {
            iVar8 = iVar10;
            if ((beat_best_palette_rd != 0) ||
               ((local_4500->sf).intra_sf.prune_palette_search_level != 2)) {
              bVar22 = false;
              iVar10 = iVar10 + 1;
            }
          }
          else {
            iVar8 = (int)local_44f0;
          }
        } while ((!bVar22) && (iVar10 <= (int)local_4510));
      }
      if (iVar8 < (int)local_4510) {
        local_44e8 = CONCAT44(local_44e8._4_4_,local_4514) & 0xffffffff000000ff;
        uVar18 = local_4510;
        do {
          iVar10 = (int)uVar18;
          if (iVar10 <= iVar8) break;
          bVar22 = false;
          beat_best_palette_rd = 0;
          local_4521 = false;
          memcpy(count_buf_8bit,top_colors,(long)iVar10 * 2);
          palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,local_44d8
                       ,(int16_t *)count_buf_8bit,iVar10,color_cache,(int)local_44e0,false,
                       local_44c8,local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,
                       beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4521,
                       (int)local_44a0);
          if (local_4521 == false) {
            if ((beat_best_palette_rd == 0) &&
               ((local_4500->sf).intra_sf.prune_palette_search_level == 2)) {
              bVar22 = false;
            }
            else {
              uVar18 = (ulong)(iVar10 - 1);
              bVar22 = true;
            }
          }
        } while (bVar22);
      }
      if (colors == 2) {
        count_buf_8bit[0]._2_2_ = (short)uVar16;
        count_buf_8bit[0]._0_2_ = sVar6;
        palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_4514,local_4504,local_44d8,
                     (int16_t *)count_buf_8bit,2,color_cache,(int)local_44e0,false,local_44c8,
                     local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,
                     best_blk_skip,tx_type_map,(int *)0x0,(_Bool *)0x0,(int)local_44a0);
        x = local_44b0;
      }
      else {
        local_44f4 = local_44f4 * local_4518;
        local_4498 = CONCAT44(local_4498._4_4_,uVar16 - uVar12);
        iVar8 = 2;
        if (1 < local_451c) {
          local_4518 = uVar16 * 3 + uVar12 * -3;
          iVar10 = uVar16 * 4 + uVar12 * -4;
          uVar18 = 2;
          local_44e8 = CONCAT44(local_44e8._4_4_,local_4514) & 0xffffffff000000ff;
          do {
            piVar15 = local_44d8;
            beat_best_palette_rd = 0;
            local_4521 = false;
            iVar8 = (int)uVar18;
            if (0 < iVar8) {
              lVar11 = uVar18 - 1;
              auVar23._8_4_ = (int)lVar11;
              auVar23._0_8_ = lVar11;
              auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
              auVar23 = auVar23 ^ _DAT_004d9940;
              lVar11 = 0;
              auVar31 = _DAT_004d9930;
              iVar9 = (int)local_4498;
              iVar13 = local_4518;
              do {
                auVar30 = auVar31 ^ _DAT_004d9940;
                if ((bool)(~(auVar23._4_4_ < auVar30._4_4_ ||
                            auVar23._0_4_ < auVar30._0_4_ && auVar30._4_4_ == auVar23._4_4_) & 1)) {
                  *(short *)((long)count_buf_8bit + lVar11) =
                       (short)(((uint)((ulong)((long)iVar9 / (long)iVar8) >> 0x1f) & 1) +
                               (int)((long)iVar9 / (long)iVar8) >> 1) + sVar6;
                }
                if (auVar30._12_4_ <= auVar23._12_4_ &&
                    (auVar30._8_4_ <= auVar23._8_4_ || auVar30._12_4_ != auVar23._12_4_)) {
                  *(short *)((long)count_buf_8bit + lVar11 + 2) =
                       (short)(((uint)((ulong)((long)iVar13 / (long)iVar8) >> 0x1f) & 1) +
                               (int)((long)iVar13 / (long)iVar8) >> 1) + sVar6;
                }
                lVar29 = auVar31._8_8_;
                auVar31._0_8_ = auVar31._0_8_ + 2;
                auVar31._8_8_ = lVar29 + 2;
                lVar11 = lVar11 + 4;
                iVar13 = iVar13 + iVar10;
                iVar9 = iVar9 + iVar10;
              } while ((ulong)(iVar8 + 1U >> 1) << 2 != lVar11);
            }
            bVar22 = (int)local_44b8 != 0;
            av1_k_means_dim1(local_44d8,(int16_t *)count_buf_8bit,local_4488,local_44f4,iVar8,0x32);
            palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,piVar15,
                         (int16_t *)count_buf_8bit,iVar8,color_cache,(int)local_44e0,bVar22,
                         local_44c8,local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,
                         beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,
                         &local_4521,(int)local_44a0);
            bVar22 = true;
            if (local_4521 == false) {
              if ((beat_best_palette_rd != 0) ||
                 ((local_4500->sf).intra_sf.prune_palette_search_level != 2)) {
                bVar22 = false;
                uVar18 = (ulong)(iVar8 + 1);
              }
            }
            else {
              iVar8 = (int)local_44f0;
            }
          } while ((!bVar22) && ((int)uVar18 <= (int)local_4510));
        }
        uVar18 = local_4510;
        x = local_44b0;
        if (iVar8 < (int)local_4510) {
          local_44b8 = CONCAT44(local_44b8._4_4_,uVar16 * 3 + uVar12 * -3);
          iVar10 = uVar16 * 4 + uVar12 * -4;
          local_4510 = CONCAT44(local_4510._4_4_,local_4514) & 0xffffffff000000ff;
          do {
            piVar15 = local_44d8;
            iVar9 = (int)uVar18;
            x = local_44b0;
            if (iVar9 <= iVar8) break;
            beat_best_palette_rd = 0;
            local_4521 = false;
            if (0 < iVar9) {
              lVar11 = (uVar18 & 0xffffffff) - 1;
              auVar24._8_4_ = (int)lVar11;
              auVar24._0_8_ = lVar11;
              auVar24._12_4_ = (int)((ulong)lVar11 >> 0x20);
              auVar24 = auVar24 ^ _DAT_004d9940;
              lVar11 = 0;
              auVar30 = _DAT_004d9930;
              iVar13 = (int)local_4498;
              iVar14 = (int)local_44b8;
              do {
                auVar31 = auVar30 ^ _DAT_004d9940;
                if ((bool)(~(auVar24._4_4_ < auVar31._4_4_ ||
                            auVar24._0_4_ < auVar31._0_4_ && auVar31._4_4_ == auVar24._4_4_) & 1)) {
                  *(short *)((long)count_buf_8bit + lVar11) =
                       (short)(((uint)((ulong)((long)iVar13 / (long)iVar9) >> 0x1f) & 1) +
                               (int)((long)iVar13 / (long)iVar9) >> 1) + sVar6;
                }
                if (auVar31._12_4_ <= auVar24._12_4_ &&
                    (auVar31._8_4_ <= auVar24._8_4_ || auVar31._12_4_ != auVar24._12_4_)) {
                  *(short *)((long)count_buf_8bit + lVar11 + 2) =
                       (short)(((uint)((ulong)((long)iVar14 / (long)iVar9) >> 0x1f) & 1) +
                               (int)((long)iVar14 / (long)iVar9) >> 1) + sVar6;
                }
                lVar29 = auVar30._8_8_;
                auVar30._0_8_ = auVar30._0_8_ + 2;
                auVar30._8_8_ = lVar29 + 2;
                lVar11 = lVar11 + 4;
                iVar14 = iVar14 + iVar10;
                iVar13 = iVar13 + iVar10;
              } while ((ulong)(iVar9 + 1U >> 1) << 2 != lVar11);
            }
            av1_k_means_dim1(local_44d8,(int16_t *)count_buf_8bit,local_4488,local_44f4,iVar9,0x32);
            palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_4510,local_4504,piVar15,
                         (int16_t *)count_buf_8bit,iVar9,color_cache,(int)local_44e0,false,
                         local_44c8,local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,
                         beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,
                         &local_4521,(int)local_44a0);
            if ((local_4521 == false) &&
               ((beat_best_palette_rd != 0 ||
                ((local_4500->sf).intra_sf.prune_palette_search_level != 2)))) {
              uVar18 = (ulong)(iVar9 - 1);
              bVar22 = true;
            }
            else {
              bVar22 = false;
            }
            x = local_44b0;
          } while (bVar22);
        }
      }
    }
    else {
      uVar20 = (ulong)(byte)(&DAT_004ed716)[local_4510];
      local_4498 = CONCAT44(local_4498._4_4_,(uint)(byte)(&DAT_004ed71f)[local_4510]);
      local_451c = (int)local_4510 + 1;
      local_44e8 = CONCAT44(local_44e8._4_4_,local_4514) & 0xffffffff000000ff;
      uVar18 = uVar20;
      local_4514 = local_451c;
      do {
        iVar8 = (int)uVar18;
        if ((int)local_4510 < iVar8) goto LAB_001e9dc2;
        bVar22 = (int)local_44b8 != 0;
        beat_best_palette_rd = 0;
        local_4521 = false;
        memcpy(count_buf_8bit,top_colors,(long)iVar8 * 2);
        palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,local_44d8,
                     (int16_t *)count_buf_8bit,iVar8,color_cache,(int)local_44e0,bVar22,local_44c8,
                     local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,
                     best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4521,(int)local_44a0);
        iVar10 = 3;
        if (local_4521 == false) {
          iVar9 = iVar8;
          if ((beat_best_palette_rd == 0) &&
             (iVar10 = 1, iVar9 = local_451c,
             (local_4500->sf).intra_sf.prune_palette_search_level == 2)) {
            local_44f0 = CONCAT44(local_44f0._4_4_,local_451c);
          }
          else {
            uVar18 = (ulong)(uint)(iVar8 + (int)local_4498);
            iVar10 = 0;
            local_451c = iVar9;
          }
        }
      } while (iVar10 == 0);
      iVar8 = (int)local_44f0;
      if (iVar10 == 3) {
LAB_001e9dc2:
        iVar8 = local_451c;
      }
      if (iVar8 <= (int)local_4510) {
        iVar10 = 3;
        if (3 < iVar8) {
          iVar10 = iVar8;
        }
        uVar7 = iVar10 - 1;
        if (iVar8 == 2) {
          uVar7 = 3;
        }
        uVar18 = (ulong)uVar7;
        if (iVar8 == (int)local_4510) {
          iVar8 = iVar8 + -1;
        }
        else {
          iVar10 = 7;
          if (iVar8 < 7) {
            iVar10 = iVar8;
          }
          iVar8 = iVar10 + 1;
        }
        local_451c = 1;
        if (1 < (int)(iVar8 - uVar7)) {
          local_451c = iVar8 - uVar7;
        }
        local_44f0 = CONCAT44(local_44f0._4_4_,iVar8);
        do {
          iVar10 = (int)uVar18;
          if (iVar8 < iVar10) break;
          bVar22 = false;
          beat_best_palette_rd = 0;
          local_4521 = false;
          memcpy(count_buf_8bit,top_colors,uVar18 * 2);
          palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,local_44d8
                       ,(int16_t *)count_buf_8bit,iVar10,color_cache,(int)local_44e0,false,
                       local_44c8,local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,
                       beat_best_rd,ctx,best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4521,
                       (int)local_44a0);
          if (local_4521 == false) {
            if ((beat_best_palette_rd == 0) &&
               ((local_4500->sf).intra_sf.prune_palette_search_level == 2)) {
              bVar22 = false;
            }
            else {
              uVar18 = (ulong)(uint)(iVar10 + local_451c);
              bVar22 = true;
            }
          }
          iVar8 = (int)local_44f0;
        } while (bVar22);
      }
      piVar15 = local_44d8;
      local_44f4 = local_44f4 * local_4518;
      local_44f0 = CONCAT44(local_44f0._4_4_,uVar16 - uVar12);
      local_4518 = uVar16 * 3 + uVar12 * -3;
      iVar8 = uVar16 * 4 + uVar12 * -4;
      do {
        iVar10 = (int)uVar20;
        iVar9 = (int)local_4510;
        if (iVar9 < iVar10) goto LAB_001ea9f6;
        beat_best_palette_rd = 0;
        local_4521 = false;
        if (0 < iVar10) {
          lVar11 = uVar20 - 1;
          auVar25._8_4_ = (int)lVar11;
          auVar25._0_8_ = lVar11;
          auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar25 = auVar25 ^ _DAT_004d9940;
          lVar11 = 0;
          auVar27 = _DAT_004d9930;
          iVar9 = (int)local_44f0;
          iVar13 = local_4518;
          do {
            auVar31 = auVar27 ^ _DAT_004d9940;
            if ((bool)(~(auVar25._4_4_ < auVar31._4_4_ ||
                        auVar25._0_4_ < auVar31._0_4_ && auVar31._4_4_ == auVar25._4_4_) & 1)) {
              *(short *)((long)count_buf_8bit + lVar11) =
                   (short)(((uint)((ulong)((long)iVar9 / (long)iVar10) >> 0x1f) & 1) +
                           (int)((long)iVar9 / (long)iVar10) >> 1) + sVar6;
            }
            if (auVar31._12_4_ <= auVar25._12_4_ &&
                (auVar31._8_4_ <= auVar25._8_4_ || auVar31._12_4_ != auVar25._12_4_)) {
              *(short *)((long)count_buf_8bit + lVar11 + 2) =
                   (short)(((uint)((ulong)((long)iVar13 / (long)iVar10) >> 0x1f) & 1) +
                           (int)((long)iVar13 / (long)iVar10) >> 1) + sVar6;
            }
            lVar29 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 2;
            auVar27._8_8_ = lVar29 + 2;
            lVar11 = lVar11 + 4;
            iVar13 = iVar13 + iVar8;
            iVar9 = iVar9 + iVar8;
          } while ((ulong)(iVar10 + 1U >> 1) << 2 != lVar11);
        }
        bVar22 = (int)local_44b8 != 0;
        av1_k_means_dim1(piVar15,(int16_t *)count_buf_8bit,local_4488,local_44f4,iVar10,0x32);
        palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,piVar15,
                     (int16_t *)count_buf_8bit,iVar10,color_cache,(int)local_44e0,bVar22,local_44c8,
                     local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,
                     best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4521,(int)local_44a0);
        iVar13 = 3;
        if (local_4521 == false) {
          iVar9 = iVar10;
          if ((beat_best_palette_rd == 0) &&
             (iVar13 = 1, iVar9 = local_4514,
             (local_4500->sf).intra_sf.prune_palette_search_level == 2)) {
            local_451c = local_4514;
          }
          else {
            uVar20 = (ulong)(uint)(iVar10 + (int)local_4498);
            iVar13 = 0;
            local_4514 = iVar9;
          }
        }
        iVar9 = (int)local_4510;
      } while (iVar13 == 0);
      iVar10 = local_451c;
      if (iVar13 == 3) {
LAB_001ea9f6:
        iVar10 = local_4514;
      }
      piVar15 = local_44d8;
      x = local_44b0;
      if (iVar10 <= iVar9) {
        iVar13 = 3;
        if (3 < iVar10) {
          iVar13 = iVar10;
        }
        uVar7 = iVar13 - 1;
        if (iVar10 == 2) {
          uVar7 = 3;
        }
        uVar18 = (ulong)uVar7;
        if (iVar10 == iVar9) {
          iVar10 = iVar10 + -1;
        }
        else {
          iVar9 = 7;
          if (iVar10 < 7) {
            iVar9 = iVar10;
          }
          iVar10 = iVar9 + 1;
        }
        iVar9 = 1;
        if (1 < (int)(iVar10 - uVar7)) {
          iVar9 = iVar10 - uVar7;
        }
        local_44b8 = CONCAT44(local_44b8._4_4_,iVar9);
        local_4510 = CONCAT44(local_4510._4_4_,uVar16 * 3 + uVar12 * -3);
        do {
          iVar9 = (int)uVar18;
          x = local_44b0;
          if (iVar10 < iVar9) break;
          beat_best_palette_rd = 0;
          local_4521 = false;
          lVar11 = uVar18 - 1;
          auVar26._8_4_ = (int)lVar11;
          auVar26._0_8_ = lVar11;
          auVar26._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar26 = auVar26 ^ _DAT_004d9940;
          uVar20 = 0;
          auVar28 = _DAT_004d9930;
          iVar13 = (int)local_44f0;
          iVar14 = (int)local_4510;
          do {
            auVar31 = auVar28 ^ _DAT_004d9940;
            if ((bool)(~(auVar31._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar31._0_4_ ||
                        auVar26._4_4_ < auVar31._4_4_) & 1)) {
              *(short *)((long)count_buf_8bit + uVar20 * 2) =
                   (short)(((uint)((ulong)((long)iVar13 / (long)iVar9) >> 0x1f) & 1) +
                           (int)((long)iVar13 / (long)iVar9) >> 1) + sVar6;
            }
            if ((auVar31._12_4_ != auVar26._12_4_ || auVar31._8_4_ <= auVar26._8_4_) &&
                auVar31._12_4_ <= auVar26._12_4_) {
              *(short *)((long)count_buf_8bit + uVar20 * 2 + 2) =
                   (short)(((uint)((ulong)((long)iVar14 / (long)iVar9) >> 0x1f) & 1) +
                           (int)((long)iVar14 / (long)iVar9) >> 1) + sVar6;
            }
            uVar20 = uVar20 + 2;
            lVar11 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 2;
            auVar28._8_8_ = lVar11 + 2;
            iVar14 = iVar14 + iVar8;
            iVar13 = iVar13 + iVar8;
          } while ((iVar9 + 1U & 0xfffffffe) != uVar20);
          av1_k_means_dim1(piVar15,(int16_t *)count_buf_8bit,local_4488,local_44f4,iVar9,0x32);
          palette_rd_y(local_4500,local_44b0,local_44d0,(BLOCK_SIZE)local_44e8,local_4504,piVar15,
                       (int16_t *)count_buf_8bit,iVar9,color_cache,(int)local_44e0,false,local_44c8,
                       local_44a8,best_rd,rate,rate_tokenonly,distortion,skippable,beat_best_rd,ctx,
                       best_blk_skip,tx_type_map,&beat_best_palette_rd,&local_4521,(int)local_44a0);
          if ((local_4521 == false) &&
             ((beat_best_palette_rd != 0 ||
              ((local_4500->sf).intra_sf.prune_palette_search_level != 2)))) {
            uVar18 = (ulong)(uint)(iVar9 + (int)local_44b8);
            bVar22 = true;
          }
          else {
            bVar22 = false;
          }
          x = local_44b0;
        } while (bVar22);
      }
    }
  }
  if ((local_44c8->palette_mode_info).palette_size[0] != '\0') {
    uVar7 = (bVar1 >> (bVar3 & 0x1f)) * local_447c;
    memcpy(local_4488,local_44a8,(ulong)uVar7);
    x->palette_pixels = x->palette_pixels + uVar7;
  }
  memcpy(local_44d0,local_44c8,0xb0);
  return;
}

Assistant:

void av1_rd_pick_palette_intra_sby(
    const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize, int dc_mode_cost,
    MB_MODE_INFO *best_mbmi, uint8_t *best_palette_color_map, int64_t *best_rd,
    int *rate, int *rate_tokenonly, int64_t *distortion, uint8_t *skippable,
    int *beat_best_rd, PICK_MODE_CONTEXT *ctx, uint8_t *best_blk_skip,
    uint8_t *tx_type_map) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  assert(av1_allow_palette(cpi->common.features.allow_screen_content_tools,
                           bsize));
  assert(PALETTE_MAX_SIZE == 8);
  assert(PALETTE_MIN_SIZE == 2);

  const int src_stride = x->plane[0].src.stride;
  const uint8_t *const src = x->plane[0].src.buf;
  int block_width, block_height, rows, cols;
  av1_get_block_dimensions(bsize, 0, xd, &block_width, &block_height, &rows,
                           &cols);
  const SequenceHeader *const seq_params = cpi->common.seq_params;
  const int is_hbd = seq_params->use_highbitdepth;
  const int bit_depth = seq_params->bit_depth;
  const int discount_color_cost = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int unused;

  int count_buf[1 << 12];  // Maximum (1 << 12) color levels.
  int colors, colors_threshold = 0;
  if (is_hbd) {
    int count_buf_8bit[1 << 8];  // Maximum (1 << 8) bins for hbd path.
    av1_count_colors_highbd(src, src_stride, rows, cols, bit_depth, count_buf,
                            count_buf_8bit, &colors_threshold, &colors);
  } else {
    av1_count_colors(src, src_stride, rows, cols, count_buf, &colors);
    colors_threshold = colors;
  }

  uint8_t *const color_map = xd->plane[0].color_index_map;
  int color_thresh_palette = x->color_palette_thresh;
  // Allow for larger color_threshold for palette search, based on color,
  // scene_change, and block source variance.
  // Since palette is Y based, only allow larger threshold if block
  // color_dist is below threshold.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode &&
      cpi->sf.rt_sf.increase_color_thresh_palette && cpi->rc.high_source_sad &&
      x->source_variance > 50) {
    int64_t norm_color_dist = 0;
    if (x->color_sensitivity[0] || x->color_sensitivity[1]) {
      norm_color_dist = x->min_dist_inter_uv >>
                        (mi_size_wide_log2[bsize] + mi_size_high_log2[bsize]);
      if (x->color_sensitivity[0] && x->color_sensitivity[1])
        norm_color_dist = norm_color_dist >> 1;
    }
    if (norm_color_dist < 8000) color_thresh_palette += 20;
  }
  if (colors_threshold > 1 && colors_threshold <= color_thresh_palette) {
    int16_t *const data = x->palette_buffer->kmeans_data_buf;
    int16_t centroids[PALETTE_MAX_SIZE];
    int lower_bound, upper_bound;
    fill_data_and_get_bounds(src, src_stride, rows, cols, is_hbd, data,
                             &lower_bound, &upper_bound);

    mbmi->mode = DC_PRED;
    mbmi->filter_intra_mode_info.use_filter_intra = 0;

    uint16_t color_cache[2 * PALETTE_MAX_SIZE];
    const int n_cache = av1_get_palette_cache(xd, 0, color_cache);

    // Find the dominant colors, stored in top_colors[].
    int16_t top_colors[PALETTE_MAX_SIZE] = { 0 };
    find_top_colors(count_buf, bit_depth, AOMMIN(colors, PALETTE_MAX_SIZE),
                    top_colors);

    // The following are the approaches used for header rdcost based gating
    // for early termination for different values of prune_palette_search_level.
    // 0: Pruning based on header rdcost for ascending order palette_size
    // search.
    // 1: When colors > PALETTE_MIN_SIZE, enabled only for coarse palette_size
    // search and for finer search do_header_rd_based_gating parameter is
    // explicitly passed as 'false'.
    // 2: Enabled only for ascending order palette_size search and for
    // descending order search do_header_rd_based_gating parameter is explicitly
    // passed as 'false'.
    const bool do_header_rd_based_gating =
        cpi->sf.intra_sf.prune_luma_palette_size_search_level != 0;

    // TODO(huisu@google.com): Try to avoid duplicate computation in cases
    // where the dominant colors and the k-means results are similar.
    if ((cpi->sf.intra_sf.prune_palette_search_level == 1) &&
        (colors > PALETTE_MIN_SIZE)) {
      // Start index and step size below are chosen to evaluate unique
      // candidates in neighbor search, in case a winner candidate is found in
      // coarse search. Example,
      // 1) 8 colors (end_n = 8): 2,3,4,5,6,7,8. start_n is chosen as 2 and step
      // size is chosen as 3. Therefore, coarse search will evaluate 2, 5 and 8.
      // If winner is found at 5, then 4 and 6 are evaluated. Similarly, for 2
      // (3) and 8 (7).
      // 2) 7 colors (end_n = 7): 2,3,4,5,6,7. If start_n is chosen as 2 (same
      // as for 8 colors) then step size should also be 2, to cover all
      // candidates. Coarse search will evaluate 2, 4 and 6. If winner is either
      // 2 or 4, 3 will be evaluated. Instead, if start_n=3 and step_size=3,
      // coarse search will evaluate 3 and 6. For the winner, unique neighbors
      // (3: 2,4 or 6: 5,7) would be evaluated.

      // Start index for coarse palette search for dominant colors and k-means
      const uint8_t start_n_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                   3, 3, 2,
                                                                   3, 3, 2 };
      // Step size for coarse palette search for dominant colors and k-means
      const uint8_t step_size_lookup_table[PALETTE_MAX_SIZE + 1] = { 0, 0, 0,
                                                                     3, 3, 3,
                                                                     3, 3, 3 };

      // Choose the start index and step size for coarse search based on number
      // of colors
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE);
      const int min_n = start_n_lookup_table[max_n];
      const int step_size = step_size_lookup_table[max_n];
      assert(min_n >= PALETTE_MIN_SIZE);
      // Perform top color coarse palette search to find the winner candidate
      const int top_color_winner = perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          step_size, do_header_rd_based_gating, &unused, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for dominant colors
      if (top_color_winner <= max_n) {
        int stage2_min_n, stage2_max_n, stage2_step_size;
        set_stage2_params(&stage2_min_n, &stage2_max_n, &stage2_step_size,
                          top_color_winner, max_n);
        // perform finer search for the winner candidate
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, stage2_min_n,
            stage2_max_n + 1, stage2_step_size,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      // Perform k-means coarse palette search to find the winner candidate
      const int k_means_winner = perform_k_means_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
          min_n, max_n + 1, step_size, do_header_rd_based_gating, &unused,
          color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
          rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
          best_blk_skip, tx_type_map, color_map, rows * cols,
          discount_color_cost);
      // Evaluate neighbors for the winner color (if winner is found) in the
      // above coarse search for k-means
      if (k_means_winner <= max_n) {
        int start_n_stage2, end_n_stage2, step_size_stage2;
        set_stage2_params(&start_n_stage2, &end_n_stage2, &step_size_stage2,
                          k_means_winner, max_n);
        // perform finer search for the winner candidate
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            start_n_stage2, end_n_stage2 + 1, step_size_stage2,
            /*do_header_rd_based_gating=*/false, &unused, color_cache, n_cache,
            best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
            distortion, skippable, beat_best_rd, ctx, best_blk_skip,
            tx_type_map, color_map, rows * cols, discount_color_cost);
      }
    } else {
      const int max_n = AOMMIN(colors, PALETTE_MAX_SIZE),
                min_n = PALETTE_MIN_SIZE;
      // Perform top color palette search in ascending order
      int last_n_searched = min_n;
      perform_top_color_palette_search(
          cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, min_n, max_n + 1,
          1, do_header_rd_based_gating, &last_n_searched, color_cache, n_cache,
          best_mbmi, best_palette_color_map, best_rd, rate, rate_tokenonly,
          distortion, skippable, beat_best_rd, ctx, best_blk_skip, tx_type_map,
          discount_color_cost);
      if (last_n_searched < max_n) {
        // Search in descending order until we get to the previous best
        perform_top_color_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, top_colors, max_n,
            last_n_searched, -1, /*do_header_rd_based_gating=*/false, &unused,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, discount_color_cost);
      }
      // K-means clustering.
      if (colors == PALETTE_MIN_SIZE) {
        // Special case: These colors automatically become the centroids.
        assert(colors == 2);
        centroids[0] = lower_bound;
        centroids[1] = upper_bound;
        palette_rd_y(cpi, x, mbmi, bsize, dc_mode_cost, data, centroids, colors,
                     color_cache, n_cache, /*do_header_rd_based_gating=*/false,
                     best_mbmi, best_palette_color_map, best_rd, rate,
                     rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
                     best_blk_skip, tx_type_map, NULL, NULL,
                     discount_color_cost);
      } else {
        // Perform k-means palette search in ascending order
        last_n_searched = min_n;
        perform_k_means_palette_search(
            cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
            min_n, max_n + 1, 1, do_header_rd_based_gating, &last_n_searched,
            color_cache, n_cache, best_mbmi, best_palette_color_map, best_rd,
            rate, rate_tokenonly, distortion, skippable, beat_best_rd, ctx,
            best_blk_skip, tx_type_map, color_map, rows * cols,
            discount_color_cost);
        if (last_n_searched < max_n) {
          // Search in descending order until we get to the previous best
          perform_k_means_palette_search(
              cpi, x, mbmi, bsize, dc_mode_cost, data, lower_bound, upper_bound,
              max_n, last_n_searched, -1, /*do_header_rd_based_gating=*/false,
              &unused, color_cache, n_cache, best_mbmi, best_palette_color_map,
              best_rd, rate, rate_tokenonly, distortion, skippable,
              beat_best_rd, ctx, best_blk_skip, tx_type_map, color_map,
              rows * cols, discount_color_cost);
        }
      }
    }
  }

  if (best_mbmi->palette_mode_info.palette_size[0] > 0) {
    memcpy(color_map, best_palette_color_map,
           block_width * block_height * sizeof(best_palette_color_map[0]));
    // Gather the stats to determine whether to use screen content tools in
    // function av1_determine_sc_tools_with_encoding().
    x->palette_pixels += (block_width * block_height);
  }
  *mbmi = *best_mbmi;
}